

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void highbd_dr_prediction_z1_32xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx,
               int bd)

{
  long lVar1;
  undefined8 *puVar2;
  uint16_t uVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint16_t *puVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  ushort uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  __m256i dstvec [128];
  undefined8 local_1060 [518];
  undefined1 auVar25 [32];
  
  lVar16 = (long)N + 0x1f;
  uVar3 = above[(long)N + 0x1f];
  auVar24._2_2_ = uVar3;
  auVar24._0_2_ = uVar3;
  auVar24._4_2_ = uVar3;
  auVar24._6_2_ = uVar3;
  auVar24._8_2_ = uVar3;
  auVar24._10_2_ = uVar3;
  auVar24._12_2_ = uVar3;
  auVar24._14_2_ = uVar3;
  auVar25._16_2_ = uVar3;
  auVar25._0_16_ = auVar24;
  auVar25._18_2_ = uVar3;
  auVar25._20_2_ = uVar3;
  auVar25._22_2_ = uVar3;
  auVar25._24_2_ = uVar3;
  auVar25._26_2_ = uVar3;
  auVar25._28_2_ = uVar3;
  auVar25._30_2_ = uVar3;
  iVar10 = (int)lVar16;
  auVar26 = auVar25._16_16_;
  auVar32._0_2_ = (undefined2)lVar16;
  if (dx < 0xc) {
    if (N < 1) {
      return;
    }
    auVar32._2_2_ = auVar32._0_2_;
    auVar32._4_2_ = auVar32._0_2_;
    auVar32._6_2_ = auVar32._0_2_;
    auVar32._8_2_ = auVar32._0_2_;
    auVar32._10_2_ = auVar32._0_2_;
    auVar32._12_2_ = auVar32._0_2_;
    auVar32._14_2_ = auVar32._0_2_;
    auVar32._16_2_ = auVar32._0_2_;
    auVar32._18_2_ = auVar32._0_2_;
    auVar32._20_2_ = auVar32._0_2_;
    auVar32._22_2_ = auVar32._0_2_;
    auVar32._24_2_ = auVar32._0_2_;
    auVar32._26_2_ = auVar32._0_2_;
    auVar32._28_2_ = auVar32._0_2_;
    auVar32._30_2_ = auVar32._0_2_;
    uVar15 = (ulong)(uint)N;
    auVar27._8_2_ = 0x10;
    auVar27._0_8_ = 0x10001000100010;
    auVar27._10_2_ = 0x10;
    auVar27._12_2_ = 0x10;
    auVar27._14_2_ = 0x10;
    auVar27._16_2_ = 0x10;
    auVar27._18_2_ = 0x10;
    auVar27._20_2_ = 0x10;
    auVar27._22_2_ = 0x10;
    auVar27._24_2_ = 0x10;
    auVar27._26_2_ = 0x10;
    auVar27._28_2_ = 0x10;
    auVar27._30_2_ = 0x10;
    lVar17 = 0;
    auVar4 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
    uVar23 = 0;
    uVar18 = upsample_above;
    do {
      iVar20 = (int)uVar18 >> 6;
      lVar13 = lVar17;
      if (iVar20 < iVar10) {
        uVar5 = (ushort)(uVar18 >> 1);
        uVar29 = uVar5 & 0x1f;
        auVar30._0_8_ = CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5))) & 0x1f001f001f001f;
        auVar30._8_2_ = uVar29;
        auVar30._10_2_ = uVar29;
        auVar30._12_2_ = uVar29;
        auVar30._14_2_ = uVar29;
        auVar30._16_2_ = uVar29;
        auVar30._18_2_ = uVar29;
        auVar30._20_2_ = uVar29;
        auVar30._22_2_ = uVar29;
        auVar30._24_2_ = uVar29;
        auVar30._26_2_ = uVar29;
        auVar30._28_2_ = uVar29;
        auVar30._30_2_ = uVar29;
        lVar22 = (long)iVar20;
        lVar13 = 0;
        bVar9 = true;
        do {
          bVar14 = bVar9;
          auVar28 = in_ZMM6._0_32_;
          lVar1 = lVar13 + lVar22;
          auVar34 = auVar25;
          if (lVar1 < lVar16) {
            auVar34 = vpsubw_avx2(*(undefined1 (*) [32])(above + lVar22 + lVar13 + 1),
                                  *(undefined1 (*) [32])(above + lVar22 + lVar13));
            auVar35 = vpmullw_avx2(auVar34,auVar30);
            auVar34 = vpsllw_avx2(*(undefined1 (*) [32])(above + lVar22 + lVar13),5);
            auVar34 = vpaddw_avx2(auVar34,auVar27);
            auVar34 = vpaddw_avx2(auVar35,auVar34);
            auVar35 = vpsrlw_avx2(auVar34,5);
            uVar21 = (uint)lVar1;
            auVar39._0_2_ = (undefined2)lVar1;
            auVar39._2_2_ = auVar39._0_2_;
            auVar39._4_2_ = auVar39._0_2_;
            auVar39._6_2_ = auVar39._0_2_;
            auVar39._8_2_ = auVar39._0_2_;
            auVar39._10_2_ = auVar39._0_2_;
            auVar39._12_2_ = auVar39._0_2_;
            auVar39._14_2_ = auVar39._0_2_;
            auVar39 = vpaddw_avx(auVar39,auVar4);
            auVar42 = vpslldq_avx(auVar39,2);
            auVar42 = vpblendw_avx(auVar42,ZEXT416(uVar21),1);
            auVar39 = vpsrldq_avx(auVar39,0xe);
            auVar40._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar24;
            auVar40._16_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar39;
            auVar51._0_2_ = (undefined2)(uVar21 + 9);
            auVar51._2_2_ = auVar51._0_2_;
            auVar51._4_2_ = auVar51._0_2_;
            auVar51._6_2_ = auVar51._0_2_;
            auVar51._8_2_ = auVar51._0_2_;
            auVar51._10_2_ = auVar51._0_2_;
            auVar51._12_2_ = auVar51._0_2_;
            auVar51._14_2_ = auVar51._0_2_;
            auVar51._16_2_ = auVar51._0_2_;
            auVar51._18_2_ = auVar51._0_2_;
            auVar51._20_2_ = auVar51._0_2_;
            auVar51._22_2_ = auVar51._0_2_;
            auVar51._24_2_ = auVar51._0_2_;
            auVar51._26_2_ = auVar51._0_2_;
            auVar51._28_2_ = auVar51._0_2_;
            auVar51._30_2_ = auVar51._0_2_;
            auVar34 = vpblendw_avx2(auVar40,auVar51,2);
            auVar52._0_2_ = (undefined2)(uVar21 + 10);
            auVar52._2_2_ = auVar52._0_2_;
            auVar52._4_2_ = auVar52._0_2_;
            auVar52._6_2_ = auVar52._0_2_;
            auVar52._8_2_ = auVar52._0_2_;
            auVar52._10_2_ = auVar52._0_2_;
            auVar52._12_2_ = auVar52._0_2_;
            auVar52._14_2_ = auVar52._0_2_;
            auVar52._16_2_ = auVar52._0_2_;
            auVar52._18_2_ = auVar52._0_2_;
            auVar52._20_2_ = auVar52._0_2_;
            auVar52._22_2_ = auVar52._0_2_;
            auVar52._24_2_ = auVar52._0_2_;
            auVar52._26_2_ = auVar52._0_2_;
            auVar52._28_2_ = auVar52._0_2_;
            auVar52._30_2_ = auVar52._0_2_;
            auVar34 = vpblendw_avx2(auVar34,auVar52,4);
            auVar53._0_2_ = (undefined2)(uVar21 + 0xb);
            auVar53._2_2_ = auVar53._0_2_;
            auVar53._4_2_ = auVar53._0_2_;
            auVar53._6_2_ = auVar53._0_2_;
            auVar53._8_2_ = auVar53._0_2_;
            auVar53._10_2_ = auVar53._0_2_;
            auVar53._12_2_ = auVar53._0_2_;
            auVar53._14_2_ = auVar53._0_2_;
            auVar53._16_2_ = auVar53._0_2_;
            auVar53._18_2_ = auVar53._0_2_;
            auVar53._20_2_ = auVar53._0_2_;
            auVar53._22_2_ = auVar53._0_2_;
            auVar53._24_2_ = auVar53._0_2_;
            auVar53._26_2_ = auVar53._0_2_;
            auVar53._28_2_ = auVar53._0_2_;
            auVar53._30_2_ = auVar53._0_2_;
            auVar34 = vpblendw_avx2(auVar34,auVar53,8);
            auVar54._0_2_ = (undefined2)(uVar21 + 0xc);
            auVar54._2_2_ = auVar54._0_2_;
            auVar54._4_2_ = auVar54._0_2_;
            auVar54._6_2_ = auVar54._0_2_;
            auVar54._8_2_ = auVar54._0_2_;
            auVar54._10_2_ = auVar54._0_2_;
            auVar54._12_2_ = auVar54._0_2_;
            auVar54._14_2_ = auVar54._0_2_;
            auVar54._16_2_ = auVar54._0_2_;
            auVar54._18_2_ = auVar54._0_2_;
            auVar54._20_2_ = auVar54._0_2_;
            auVar54._22_2_ = auVar54._0_2_;
            auVar54._24_2_ = auVar54._0_2_;
            auVar54._26_2_ = auVar54._0_2_;
            auVar54._28_2_ = auVar54._0_2_;
            auVar54._30_2_ = auVar54._0_2_;
            auVar34 = vpblendw_avx2(auVar34,auVar54,0x10);
            auVar55._0_2_ = (undefined2)(uVar21 + 0xd);
            auVar55._2_2_ = auVar55._0_2_;
            auVar55._4_2_ = auVar55._0_2_;
            auVar55._6_2_ = auVar55._0_2_;
            auVar55._8_2_ = auVar55._0_2_;
            auVar55._10_2_ = auVar55._0_2_;
            auVar55._12_2_ = auVar55._0_2_;
            auVar55._14_2_ = auVar55._0_2_;
            auVar55._16_2_ = auVar55._0_2_;
            auVar55._18_2_ = auVar55._0_2_;
            auVar55._20_2_ = auVar55._0_2_;
            auVar55._22_2_ = auVar55._0_2_;
            auVar55._24_2_ = auVar55._0_2_;
            auVar55._26_2_ = auVar55._0_2_;
            auVar55._28_2_ = auVar55._0_2_;
            auVar55._30_2_ = auVar55._0_2_;
            auVar34 = vpblendw_avx2(auVar34,auVar55,0x20);
            auVar56._0_2_ = (undefined2)(uVar21 + 0xe);
            auVar56._2_2_ = auVar56._0_2_;
            auVar56._4_2_ = auVar56._0_2_;
            auVar56._6_2_ = auVar56._0_2_;
            auVar56._8_2_ = auVar56._0_2_;
            auVar56._10_2_ = auVar56._0_2_;
            auVar56._12_2_ = auVar56._0_2_;
            auVar56._14_2_ = auVar56._0_2_;
            auVar56._16_2_ = auVar56._0_2_;
            auVar56._18_2_ = auVar56._0_2_;
            auVar56._20_2_ = auVar56._0_2_;
            auVar56._22_2_ = auVar56._0_2_;
            auVar56._24_2_ = auVar56._0_2_;
            auVar56._26_2_ = auVar56._0_2_;
            auVar56._28_2_ = auVar56._0_2_;
            auVar56._30_2_ = auVar56._0_2_;
            auVar34 = vpblendw_avx2(auVar34,auVar56,0x40);
            auVar57._0_2_ = (undefined2)(uVar21 + 0xf);
            auVar57._2_2_ = auVar57._0_2_;
            auVar57._4_2_ = auVar57._0_2_;
            auVar57._6_2_ = auVar57._0_2_;
            auVar57._8_2_ = auVar57._0_2_;
            auVar57._10_2_ = auVar57._0_2_;
            auVar57._12_2_ = auVar57._0_2_;
            auVar57._14_2_ = auVar57._0_2_;
            auVar57._16_2_ = auVar57._0_2_;
            auVar57._18_2_ = auVar57._0_2_;
            auVar57._20_2_ = auVar57._0_2_;
            auVar57._22_2_ = auVar57._0_2_;
            auVar57._24_2_ = auVar57._0_2_;
            auVar57._26_2_ = auVar57._0_2_;
            auVar57._28_2_ = auVar57._0_2_;
            auVar57._30_2_ = auVar57._0_2_;
            auVar34 = vpblendw_avx2(auVar34,auVar57,0x80);
            auVar34 = vpblendd_avx2(ZEXT1632(auVar42),auVar34,0xf0);
            auVar34 = vpcmpgtw_avx2(auVar32,auVar34);
            auVar34 = vpblendvb_avx2(auVar25,auVar35,auVar34);
          }
          in_ZMM6 = ZEXT3264(auVar34);
          lVar13 = 0x10;
          bVar9 = false;
        } while (bVar14);
        *(undefined1 (*) [32])(local_1060 + uVar23 * 4) = auVar28;
        *(undefined1 (*) [32])(local_1060 + uVar15 * 4 + uVar23 * 4) = auVar34;
        uVar18 = uVar18 + upsample_above;
      }
      else {
        do {
          *(undefined1 (*) [32])((long)local_1060 + lVar13) = auVar25;
          *(undefined1 (*) [32])((long)local_1060 + lVar13 + uVar15 * 0x20) = auVar25;
          lVar13 = lVar13 + 0x20;
        } while (uVar15 * 0x20 != lVar13);
      }
      if (iVar10 <= iVar20) break;
      uVar23 = uVar23 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar23 != uVar15);
  }
  else {
    if (N < 1) {
      return;
    }
    auVar34._2_2_ = auVar32._0_2_;
    auVar34._0_2_ = auVar32._0_2_;
    auVar34._4_2_ = auVar32._0_2_;
    auVar34._6_2_ = auVar32._0_2_;
    auVar34._8_2_ = auVar32._0_2_;
    auVar34._10_2_ = auVar32._0_2_;
    auVar34._12_2_ = auVar32._0_2_;
    auVar34._14_2_ = auVar32._0_2_;
    auVar34._16_2_ = auVar32._0_2_;
    auVar34._18_2_ = auVar32._0_2_;
    auVar34._20_2_ = auVar32._0_2_;
    auVar34._22_2_ = auVar32._0_2_;
    auVar34._24_2_ = auVar32._0_2_;
    auVar34._26_2_ = auVar32._0_2_;
    auVar34._28_2_ = auVar32._0_2_;
    auVar34._30_2_ = auVar32._0_2_;
    uVar15 = (ulong)(uint)N;
    auVar28._8_4_ = 0x10;
    auVar28._0_8_ = 0x1000000010;
    auVar28._12_4_ = 0x10;
    auVar28._16_4_ = 0x10;
    auVar28._20_4_ = 0x10;
    auVar28._24_4_ = 0x10;
    auVar28._28_4_ = 0x10;
    lVar17 = 0;
    auVar4 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
    uVar23 = 0;
    uVar18 = upsample_above;
    do {
      uVar21 = (int)uVar18 >> 6;
      lVar13 = lVar17;
      if ((int)uVar21 < iVar10) {
        uVar11 = uVar18 >> 1;
        uVar12 = uVar11 & 0x1f801f;
        auVar35._0_8_ = CONCAT44(uVar11,uVar11) & 0x1f801f001f801f;
        auVar35._8_4_ = uVar12;
        auVar35._12_4_ = uVar12;
        auVar35._16_4_ = uVar12;
        auVar35._20_4_ = uVar12;
        auVar35._24_4_ = uVar12;
        auVar35._28_4_ = uVar12;
        lVar13 = (long)(int)uVar21;
        auVar32 = auVar25;
        if (lVar13 < lVar16) {
          auVar39 = auVar24;
          if (8 < (ulong)(lVar16 - lVar13)) {
            auVar32 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar13 + 8));
            auVar36 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar13 + 9));
            auVar36 = vpsubd_avx2(auVar36,auVar32);
            auVar32 = vpslld_avx2(auVar32,5);
            auVar36 = vpmulld_avx2(auVar36,auVar35);
            auVar32 = vpaddd_avx2(auVar32,auVar28);
            auVar32 = vpaddd_avx2(auVar36,auVar32);
            auVar32 = vpsrld_avx2(auVar32,5);
            auVar36._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar32._16_16_;
            auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
            auVar32 = vpackusdw_avx2(auVar32,auVar36);
            auVar39 = auVar32._0_16_;
          }
          auVar32 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar13));
          auVar36 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar13 + 1));
          auVar36 = vpsubd_avx2(auVar36,auVar32);
          auVar32 = vpslld_avx2(auVar32,5);
          auVar36 = vpmulld_avx2(auVar36,auVar35);
          auVar32 = vpaddd_avx2(auVar32,auVar28);
          auVar32 = vpaddd_avx2(auVar36,auVar32);
          auVar32 = vpsrld_avx2(auVar32,5);
          auVar32 = vpackusdw_avx2(auVar32,ZEXT1632(auVar32._16_16_));
          auVar42._0_2_ = (undefined2)uVar21;
          auVar42._2_2_ = auVar42._0_2_;
          auVar42._4_2_ = auVar42._0_2_;
          auVar42._6_2_ = auVar42._0_2_;
          auVar42._8_2_ = auVar42._0_2_;
          auVar42._10_2_ = auVar42._0_2_;
          auVar42._12_2_ = auVar42._0_2_;
          auVar42._14_2_ = auVar42._0_2_;
          auVar42 = vpaddw_avx(auVar42,auVar4);
          auVar43 = vpslldq_avx(auVar42,2);
          auVar43 = vpblendw_avx(auVar43,ZEXT416(uVar21),1);
          auVar42 = vpsrldq_avx(auVar42,0xe);
          auVar41._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar24;
          auVar41._16_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar42;
          auVar58._0_2_ = (undefined2)(uVar21 + 9);
          auVar58._2_2_ = auVar58._0_2_;
          auVar58._4_2_ = auVar58._0_2_;
          auVar58._6_2_ = auVar58._0_2_;
          auVar58._8_2_ = auVar58._0_2_;
          auVar58._10_2_ = auVar58._0_2_;
          auVar58._12_2_ = auVar58._0_2_;
          auVar58._14_2_ = auVar58._0_2_;
          auVar58._16_2_ = auVar58._0_2_;
          auVar58._18_2_ = auVar58._0_2_;
          auVar58._20_2_ = auVar58._0_2_;
          auVar58._22_2_ = auVar58._0_2_;
          auVar58._24_2_ = auVar58._0_2_;
          auVar58._26_2_ = auVar58._0_2_;
          auVar58._28_2_ = auVar58._0_2_;
          auVar58._30_2_ = auVar58._0_2_;
          auVar36 = vpblendw_avx2(auVar41,auVar58,2);
          auVar59._0_2_ = (undefined2)(uVar21 + 10);
          auVar59._2_2_ = auVar59._0_2_;
          auVar59._4_2_ = auVar59._0_2_;
          auVar59._6_2_ = auVar59._0_2_;
          auVar59._8_2_ = auVar59._0_2_;
          auVar59._10_2_ = auVar59._0_2_;
          auVar59._12_2_ = auVar59._0_2_;
          auVar59._14_2_ = auVar59._0_2_;
          auVar59._16_2_ = auVar59._0_2_;
          auVar59._18_2_ = auVar59._0_2_;
          auVar59._20_2_ = auVar59._0_2_;
          auVar59._22_2_ = auVar59._0_2_;
          auVar59._24_2_ = auVar59._0_2_;
          auVar59._26_2_ = auVar59._0_2_;
          auVar59._28_2_ = auVar59._0_2_;
          auVar59._30_2_ = auVar59._0_2_;
          auVar36 = vpblendw_avx2(auVar36,auVar59,4);
          auVar60._0_2_ = (undefined2)(uVar21 + 0xb);
          auVar60._2_2_ = auVar60._0_2_;
          auVar60._4_2_ = auVar60._0_2_;
          auVar60._6_2_ = auVar60._0_2_;
          auVar60._8_2_ = auVar60._0_2_;
          auVar60._10_2_ = auVar60._0_2_;
          auVar60._12_2_ = auVar60._0_2_;
          auVar60._14_2_ = auVar60._0_2_;
          auVar60._16_2_ = auVar60._0_2_;
          auVar60._18_2_ = auVar60._0_2_;
          auVar60._20_2_ = auVar60._0_2_;
          auVar60._22_2_ = auVar60._0_2_;
          auVar60._24_2_ = auVar60._0_2_;
          auVar60._26_2_ = auVar60._0_2_;
          auVar60._28_2_ = auVar60._0_2_;
          auVar60._30_2_ = auVar60._0_2_;
          auVar36 = vpblendw_avx2(auVar36,auVar60,8);
          auVar61._0_2_ = (undefined2)(uVar21 + 0xc);
          auVar61._2_2_ = auVar61._0_2_;
          auVar61._4_2_ = auVar61._0_2_;
          auVar61._6_2_ = auVar61._0_2_;
          auVar61._8_2_ = auVar61._0_2_;
          auVar61._10_2_ = auVar61._0_2_;
          auVar61._12_2_ = auVar61._0_2_;
          auVar61._14_2_ = auVar61._0_2_;
          auVar61._16_2_ = auVar61._0_2_;
          auVar61._18_2_ = auVar61._0_2_;
          auVar61._20_2_ = auVar61._0_2_;
          auVar61._22_2_ = auVar61._0_2_;
          auVar61._24_2_ = auVar61._0_2_;
          auVar61._26_2_ = auVar61._0_2_;
          auVar61._28_2_ = auVar61._0_2_;
          auVar61._30_2_ = auVar61._0_2_;
          auVar36 = vpblendw_avx2(auVar36,auVar61,0x10);
          auVar62._0_2_ = (undefined2)(uVar21 + 0xd);
          auVar62._2_2_ = auVar62._0_2_;
          auVar62._4_2_ = auVar62._0_2_;
          auVar62._6_2_ = auVar62._0_2_;
          auVar62._8_2_ = auVar62._0_2_;
          auVar62._10_2_ = auVar62._0_2_;
          auVar62._12_2_ = auVar62._0_2_;
          auVar62._14_2_ = auVar62._0_2_;
          auVar62._16_2_ = auVar62._0_2_;
          auVar62._18_2_ = auVar62._0_2_;
          auVar62._20_2_ = auVar62._0_2_;
          auVar62._22_2_ = auVar62._0_2_;
          auVar62._24_2_ = auVar62._0_2_;
          auVar62._26_2_ = auVar62._0_2_;
          auVar62._28_2_ = auVar62._0_2_;
          auVar62._30_2_ = auVar62._0_2_;
          auVar36 = vpblendw_avx2(auVar36,auVar62,0x20);
          auVar63._0_2_ = (undefined2)(uVar21 + 0xe);
          auVar63._2_2_ = auVar63._0_2_;
          auVar63._4_2_ = auVar63._0_2_;
          auVar63._6_2_ = auVar63._0_2_;
          auVar63._8_2_ = auVar63._0_2_;
          auVar63._10_2_ = auVar63._0_2_;
          auVar63._12_2_ = auVar63._0_2_;
          auVar63._14_2_ = auVar63._0_2_;
          auVar63._16_2_ = auVar63._0_2_;
          auVar63._18_2_ = auVar63._0_2_;
          auVar63._20_2_ = auVar63._0_2_;
          auVar63._22_2_ = auVar63._0_2_;
          auVar63._24_2_ = auVar63._0_2_;
          auVar63._26_2_ = auVar63._0_2_;
          auVar63._28_2_ = auVar63._0_2_;
          auVar63._30_2_ = auVar63._0_2_;
          auVar36 = vpblendw_avx2(auVar36,auVar63,0x40);
          auVar64._0_2_ = (undefined2)(uVar21 + 0xf);
          auVar64._2_2_ = auVar64._0_2_;
          auVar64._4_2_ = auVar64._0_2_;
          auVar64._6_2_ = auVar64._0_2_;
          auVar64._8_2_ = auVar64._0_2_;
          auVar64._10_2_ = auVar64._0_2_;
          auVar64._12_2_ = auVar64._0_2_;
          auVar64._14_2_ = auVar64._0_2_;
          auVar64._16_2_ = auVar64._0_2_;
          auVar64._18_2_ = auVar64._0_2_;
          auVar64._20_2_ = auVar64._0_2_;
          auVar64._22_2_ = auVar64._0_2_;
          auVar64._24_2_ = auVar64._0_2_;
          auVar64._26_2_ = auVar64._0_2_;
          auVar64._28_2_ = auVar64._0_2_;
          auVar64._30_2_ = auVar64._0_2_;
          auVar36 = vpblendw_avx2(auVar36,auVar64,0x80);
          auVar36 = vpblendd_avx2(ZEXT1632(auVar43),auVar36,0xf0);
          auVar36 = vpcmpgtw_avx2(auVar34,auVar36);
          auVar33._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar32._0_16_;
          auVar33._16_16_ = ZEXT116(0) * auVar32._16_16_ + ZEXT116(1) * auVar39;
          auVar32 = vpblendvb_avx2(auVar25,auVar33,auVar36);
        }
        *(undefined1 (*) [32])(local_1060 + uVar23 * 4) = auVar32;
        lVar22 = lVar13 + 0x10;
        auVar32 = auVar25;
        if (lVar22 < lVar16) {
          auVar39 = auVar24;
          if (8 < (ulong)(lVar16 - lVar22)) {
            auVar32 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar13 + 0x18));
            auVar36 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar13 + 0x19));
            auVar36 = vpsubd_avx2(auVar36,auVar32);
            auVar32 = vpslld_avx2(auVar32,5);
            auVar36 = vpmulld_avx2(auVar36,auVar35);
            auVar32 = vpaddd_avx2(auVar32,auVar28);
            auVar32 = vpaddd_avx2(auVar36,auVar32);
            auVar32 = vpsrld_avx2(auVar32,5);
            auVar37._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar32._16_16_;
            auVar37._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
            auVar32 = vpackusdw_avx2(auVar32,auVar37);
            auVar39 = auVar32._0_16_;
          }
          auVar32 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar13 + 0x10));
          auVar36 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar13 + 0x11));
          auVar36 = vpsubd_avx2(auVar36,auVar32);
          auVar32 = vpslld_avx2(auVar32,5);
          auVar35 = vpmulld_avx2(auVar36,auVar35);
          auVar32 = vpaddd_avx2(auVar32,auVar28);
          auVar32 = vpaddd_avx2(auVar35,auVar32);
          auVar32 = vpsrld_avx2(auVar32,5);
          auVar32 = vpackusdw_avx2(auVar32,ZEXT1632(auVar32._16_16_));
          uVar21 = (uint)lVar22;
          auVar43._0_2_ = (undefined2)lVar22;
          auVar43._2_2_ = auVar43._0_2_;
          auVar43._4_2_ = auVar43._0_2_;
          auVar43._6_2_ = auVar43._0_2_;
          auVar43._8_2_ = auVar43._0_2_;
          auVar43._10_2_ = auVar43._0_2_;
          auVar43._12_2_ = auVar43._0_2_;
          auVar43._14_2_ = auVar43._0_2_;
          auVar42 = vpaddw_avx(auVar43,auVar4);
          auVar43 = vpslldq_avx(auVar42,2);
          auVar43 = vpblendw_avx(auVar43,ZEXT416(uVar21),1);
          auVar42 = vpsrldq_avx(auVar42,0xe);
          auVar38._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar24;
          auVar38._16_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar42;
          auVar44._0_2_ = (undefined2)(uVar21 + 9);
          auVar44._2_2_ = auVar44._0_2_;
          auVar44._4_2_ = auVar44._0_2_;
          auVar44._6_2_ = auVar44._0_2_;
          auVar44._8_2_ = auVar44._0_2_;
          auVar44._10_2_ = auVar44._0_2_;
          auVar44._12_2_ = auVar44._0_2_;
          auVar44._14_2_ = auVar44._0_2_;
          auVar44._16_2_ = auVar44._0_2_;
          auVar44._18_2_ = auVar44._0_2_;
          auVar44._20_2_ = auVar44._0_2_;
          auVar44._22_2_ = auVar44._0_2_;
          auVar44._24_2_ = auVar44._0_2_;
          auVar44._26_2_ = auVar44._0_2_;
          auVar44._28_2_ = auVar44._0_2_;
          auVar44._30_2_ = auVar44._0_2_;
          auVar35 = vpblendw_avx2(auVar38,auVar44,2);
          auVar45._0_2_ = (undefined2)(uVar21 + 10);
          auVar45._2_2_ = auVar45._0_2_;
          auVar45._4_2_ = auVar45._0_2_;
          auVar45._6_2_ = auVar45._0_2_;
          auVar45._8_2_ = auVar45._0_2_;
          auVar45._10_2_ = auVar45._0_2_;
          auVar45._12_2_ = auVar45._0_2_;
          auVar45._14_2_ = auVar45._0_2_;
          auVar45._16_2_ = auVar45._0_2_;
          auVar45._18_2_ = auVar45._0_2_;
          auVar45._20_2_ = auVar45._0_2_;
          auVar45._22_2_ = auVar45._0_2_;
          auVar45._24_2_ = auVar45._0_2_;
          auVar45._26_2_ = auVar45._0_2_;
          auVar45._28_2_ = auVar45._0_2_;
          auVar45._30_2_ = auVar45._0_2_;
          auVar35 = vpblendw_avx2(auVar35,auVar45,4);
          auVar46._0_2_ = (undefined2)(uVar21 + 0xb);
          auVar46._2_2_ = auVar46._0_2_;
          auVar46._4_2_ = auVar46._0_2_;
          auVar46._6_2_ = auVar46._0_2_;
          auVar46._8_2_ = auVar46._0_2_;
          auVar46._10_2_ = auVar46._0_2_;
          auVar46._12_2_ = auVar46._0_2_;
          auVar46._14_2_ = auVar46._0_2_;
          auVar46._16_2_ = auVar46._0_2_;
          auVar46._18_2_ = auVar46._0_2_;
          auVar46._20_2_ = auVar46._0_2_;
          auVar46._22_2_ = auVar46._0_2_;
          auVar46._24_2_ = auVar46._0_2_;
          auVar46._26_2_ = auVar46._0_2_;
          auVar46._28_2_ = auVar46._0_2_;
          auVar46._30_2_ = auVar46._0_2_;
          auVar35 = vpblendw_avx2(auVar35,auVar46,8);
          auVar47._0_2_ = (undefined2)(uVar21 + 0xc);
          auVar47._2_2_ = auVar47._0_2_;
          auVar47._4_2_ = auVar47._0_2_;
          auVar47._6_2_ = auVar47._0_2_;
          auVar47._8_2_ = auVar47._0_2_;
          auVar47._10_2_ = auVar47._0_2_;
          auVar47._12_2_ = auVar47._0_2_;
          auVar47._14_2_ = auVar47._0_2_;
          auVar47._16_2_ = auVar47._0_2_;
          auVar47._18_2_ = auVar47._0_2_;
          auVar47._20_2_ = auVar47._0_2_;
          auVar47._22_2_ = auVar47._0_2_;
          auVar47._24_2_ = auVar47._0_2_;
          auVar47._26_2_ = auVar47._0_2_;
          auVar47._28_2_ = auVar47._0_2_;
          auVar47._30_2_ = auVar47._0_2_;
          auVar35 = vpblendw_avx2(auVar35,auVar47,0x10);
          auVar48._0_2_ = (undefined2)(uVar21 + 0xd);
          auVar48._2_2_ = auVar48._0_2_;
          auVar48._4_2_ = auVar48._0_2_;
          auVar48._6_2_ = auVar48._0_2_;
          auVar48._8_2_ = auVar48._0_2_;
          auVar48._10_2_ = auVar48._0_2_;
          auVar48._12_2_ = auVar48._0_2_;
          auVar48._14_2_ = auVar48._0_2_;
          auVar48._16_2_ = auVar48._0_2_;
          auVar48._18_2_ = auVar48._0_2_;
          auVar48._20_2_ = auVar48._0_2_;
          auVar48._22_2_ = auVar48._0_2_;
          auVar48._24_2_ = auVar48._0_2_;
          auVar48._26_2_ = auVar48._0_2_;
          auVar48._28_2_ = auVar48._0_2_;
          auVar48._30_2_ = auVar48._0_2_;
          auVar35 = vpblendw_avx2(auVar35,auVar48,0x20);
          auVar49._0_2_ = (undefined2)(uVar21 + 0xe);
          auVar49._2_2_ = auVar49._0_2_;
          auVar49._4_2_ = auVar49._0_2_;
          auVar49._6_2_ = auVar49._0_2_;
          auVar49._8_2_ = auVar49._0_2_;
          auVar49._10_2_ = auVar49._0_2_;
          auVar49._12_2_ = auVar49._0_2_;
          auVar49._14_2_ = auVar49._0_2_;
          auVar49._16_2_ = auVar49._0_2_;
          auVar49._18_2_ = auVar49._0_2_;
          auVar49._20_2_ = auVar49._0_2_;
          auVar49._22_2_ = auVar49._0_2_;
          auVar49._24_2_ = auVar49._0_2_;
          auVar49._26_2_ = auVar49._0_2_;
          auVar49._28_2_ = auVar49._0_2_;
          auVar49._30_2_ = auVar49._0_2_;
          auVar35 = vpblendw_avx2(auVar35,auVar49,0x40);
          auVar50._0_2_ = (undefined2)(uVar21 + 0xf);
          auVar50._2_2_ = auVar50._0_2_;
          auVar50._4_2_ = auVar50._0_2_;
          auVar50._6_2_ = auVar50._0_2_;
          auVar50._8_2_ = auVar50._0_2_;
          auVar50._10_2_ = auVar50._0_2_;
          auVar50._12_2_ = auVar50._0_2_;
          auVar50._14_2_ = auVar50._0_2_;
          auVar50._16_2_ = auVar50._0_2_;
          auVar50._18_2_ = auVar50._0_2_;
          auVar50._20_2_ = auVar50._0_2_;
          auVar50._22_2_ = auVar50._0_2_;
          auVar50._24_2_ = auVar50._0_2_;
          auVar50._26_2_ = auVar50._0_2_;
          auVar50._28_2_ = auVar50._0_2_;
          auVar50._30_2_ = auVar50._0_2_;
          auVar35 = vpblendw_avx2(auVar35,auVar50,0x80);
          auVar35 = vpblendd_avx2(ZEXT1632(auVar43),auVar35,0xf0);
          auVar35 = vpcmpgtw_avx2(auVar34,auVar35);
          auVar31._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar32._0_16_;
          auVar31._16_16_ = ZEXT116(0) * auVar32._16_16_ + ZEXT116(1) * auVar39;
          auVar32 = vpblendvb_avx2(auVar25,auVar31,auVar35);
        }
        *(undefined1 (*) [32])(local_1060 + uVar15 * 4 + uVar23 * 4) = auVar32;
        uVar18 = uVar18 + upsample_above;
      }
      else {
        do {
          *(undefined1 (*) [32])((long)local_1060 + lVar13) = auVar25;
          *(undefined1 (*) [32])((long)local_1060 + lVar13 + uVar15 * 0x20) = auVar25;
          lVar13 = lVar13 + 0x20;
        } while (uVar15 * 0x20 != lVar13);
        if (iVar10 <= (int)uVar21) break;
      }
      uVar23 = uVar23 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar23 != uVar15);
  }
  if (0 < N) {
    puVar19 = dst + 0x10;
    lVar16 = 0;
    do {
      uVar6 = *(undefined8 *)((long)local_1060 + lVar16 + 8);
      uVar7 = *(undefined8 *)((long)local_1060 + lVar16 + 0x10);
      uVar8 = *(undefined8 *)((long)local_1060 + lVar16 + 0x18);
      *(undefined8 *)(puVar19 + -0x10) = *(undefined8 *)((long)local_1060 + lVar16);
      *(undefined8 *)(puVar19 + -0xc) = uVar6;
      *(undefined8 *)(puVar19 + -8) = uVar7;
      *(undefined8 *)(puVar19 + -4) = uVar8;
      puVar2 = (undefined8 *)((long)local_1060 + lVar16 + (ulong)(uint)N * 0x20);
      uVar6 = puVar2[1];
      uVar7 = puVar2[2];
      uVar8 = puVar2[3];
      *(undefined8 *)puVar19 = *puVar2;
      *(undefined8 *)(puVar19 + 4) = uVar6;
      *(undefined8 *)(puVar19 + 8) = uVar7;
      *(undefined8 *)(puVar19 + 0xc) = uVar8;
      lVar16 = lVar16 + 0x20;
      puVar19 = puVar19 + stride;
    } while ((ulong)(uint)N * 0x20 != lVar16);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_32xN_avx2(int N, uint16_t *dst,
                                              ptrdiff_t stride,
                                              const uint16_t *above,
                                              int upsample_above, int dx,
                                              int bd) {
  __m256i dstvec[128];
  if (bd < 12) {
    highbd_dr_prediction_z1_32xN_internal_avx2(N, dstvec, above, upsample_above,
                                               dx);
  } else {
    highbd_dr_prediction_32bit_z1_32xN_internal_avx2(N, dstvec, above,
                                                     upsample_above, dx);
  }
  for (int i = 0; i < N; i++) {
    _mm256_storeu_si256((__m256i *)(dst + stride * i), dstvec[i]);
    _mm256_storeu_si256((__m256i *)(dst + stride * i + 16), dstvec[i + N]);
  }
}